

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O2

int pcre2_substring_list_get_16
              (pcre2_match_data_16 *match_data,PCRE2_UCHAR16 ***listptr,size_t **lengthsptr)

{
  PCRE2_UCHAR16 **ppPVar1;
  undefined2 *puVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  size_t *psVar10;
  size_t *__dest;
  
  uVar6 = match_data->rc;
  if (-1 < (int)uVar6) {
    if (uVar6 == 0) {
      uVar6 = (uint)match_data->oveccount;
    }
    uVar7 = (ulong)uVar6;
    sVar8 = 0x20;
    if (lengthsptr != (size_t **)0x0) {
      sVar8 = uVar7 * 8 + 0x20;
    }
    for (uVar5 = 0; uVar5 < uVar6 * 2; uVar5 = uVar5 + 2) {
      lVar9 = (match_data->ovector[uVar5 + 1] - match_data->ovector[uVar5]) * 2;
      if (match_data->ovector[uVar5 + 1] <= match_data->ovector[uVar5]) {
        lVar9 = 0;
      }
      sVar8 = sVar8 + lVar9 + 10;
    }
    pvVar4 = _pcre2_memctl_malloc_16(sVar8,&match_data->memctl);
    if (pvVar4 == (void *)0x0) {
      uVar6 = 0xffffffd0;
    }
    else {
      ppPVar1 = (PCRE2_UCHAR16 **)((long)pvVar4 + 0x18);
      *listptr = ppPVar1;
      __dest = (size_t *)((long)pvVar4 + uVar7 * 8 + 0x20);
      if (lengthsptr == (size_t **)0x0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        *lengthsptr = __dest;
        psVar10 = __dest;
        __dest = __dest + uVar7;
      }
      for (uVar7 = 0; uVar7 < uVar6 * 2; uVar7 = uVar7 + 2) {
        uVar5 = match_data->ovector[uVar7];
        uVar3 = match_data->ovector[uVar7 + 1];
        sVar8 = 0;
        if (uVar5 <= uVar3) {
          sVar8 = uVar3 - uVar5;
        }
        if (uVar5 <= uVar3 && uVar3 - uVar5 != 0) {
          memcpy(__dest,match_data->subject + uVar5,sVar8 * 2);
        }
        *(size_t **)((long)ppPVar1 + uVar7 * 4) = __dest;
        if (psVar10 == (size_t *)0x0) {
          psVar10 = (size_t *)0x0;
        }
        else {
          *psVar10 = sVar8;
          psVar10 = psVar10 + 1;
        }
        puVar2 = (undefined2 *)((long)__dest + sVar8 * 2);
        __dest = (size_t *)(puVar2 + 1);
        *puVar2 = 0;
      }
      *(undefined8 *)((long)ppPVar1 + uVar7 * 4) = 0;
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_list_get(pcre2_match_data *match_data, PCRE2_UCHAR ***listptr,
  PCRE2_SIZE **lengthsptr)
{
int i, count, count2;
PCRE2_SIZE size;
PCRE2_SIZE *lensp;
pcre2_memctl *memp;
PCRE2_UCHAR **listp;
PCRE2_UCHAR *sp;
PCRE2_SIZE *ovector;

if ((count = match_data->rc) < 0) return count;   /* Match failed */
if (count == 0) count = match_data->oveccount;    /* Ovector too small */

count2 = 2*count;
ovector = match_data->ovector;
size = sizeof(pcre2_memctl) + sizeof(PCRE2_UCHAR *);      /* For final NULL */
if (lengthsptr != NULL) size += sizeof(PCRE2_SIZE) * count;  /* For lengths */

for (i = 0; i < count2; i += 2)
  {
  size += sizeof(PCRE2_UCHAR *) + CU2BYTES(1);
  if (ovector[i+1] > ovector[i]) size += CU2BYTES(ovector[i+1] - ovector[i]);
  }

memp = PRIV(memctl_malloc)(size, (pcre2_memctl *)match_data);
if (memp == NULL) return PCRE2_ERROR_NOMEMORY;

*listptr = listp = (PCRE2_UCHAR **)((char *)memp + sizeof(pcre2_memctl));
lensp = (PCRE2_SIZE *)((char *)listp + sizeof(PCRE2_UCHAR *) * (count + 1));

if (lengthsptr == NULL)
  {
  sp = (PCRE2_UCHAR *)lensp;
  lensp = NULL;
  }
else
  {
  *lengthsptr = lensp;
  sp = (PCRE2_UCHAR *)((char *)lensp + sizeof(PCRE2_SIZE) * count);
  }

for (i = 0; i < count2; i += 2)
  {
  size = (ovector[i+1] > ovector[i])? (ovector[i+1] - ovector[i]) : 0;

  /* Size == 0 includes the case when the capture is unset. Avoid adding
  PCRE2_UNSET to match_data->subject because it overflows, even though with
  zero size calling memcpy() is harmless. */

  if (size != 0) memcpy(sp, match_data->subject + ovector[i], CU2BYTES(size));
  *listp++ = sp;
  if (lensp != NULL) *lensp++ = size;
  sp += size;
  *sp++ = 0;
  }

*listp = NULL;
return 0;
}